

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O0

QPauseAnimation * __thiscall
QSequentialAnimationGroup::insertPause(QSequentialAnimationGroup *this,int index,int msecs)

{
  long lVar1;
  QSequentialAnimationGroupPrivate *pQVar2;
  qsizetype qVar3;
  int in_ESI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QPauseAnimation *pause;
  QSequentialAnimationGroupPrivate *d;
  char *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  int line;
  char *in_stack_ffffffffffffff88;
  QObject *in_stack_ffffffffffffff90;
  int msecs_00;
  QPauseAnimation *in_stack_ffffffffffffffa0;
  QAnimationGroup *in_stack_ffffffffffffffa8;
  QPauseAnimation *local_30;
  int in_stack_ffffffffffffffdc;
  
  msecs_00 = (int)((ulong)in_RDI >> 0x20);
  line = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QSequentialAnimationGroup *)0x68a788);
  if (-1 < in_ESI) {
    in_stack_ffffffffffffff90 = (QObject *)(long)in_ESI;
    qVar3 = QList<QAbstractAnimation_*>::size(&(pQVar2->super_QAnimationGroupPrivate).animations);
    if ((long)in_stack_ffffffffffffff90 <= qVar3) {
      local_30 = (QPauseAnimation *)operator_new(0x10);
      QPauseAnimation::QPauseAnimation(in_stack_ffffffffffffffa0,msecs_00,in_stack_ffffffffffffff90)
      ;
      QAnimationGroup::insertAnimation
                (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffdc,
                 &in_stack_ffffffffffffffa0->super_QAbstractAnimation);
      goto LAB_0068a85d;
    }
  }
  QMessageLogger::QMessageLogger
            ((QMessageLogger *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,line,
             in_stack_ffffffffffffff78);
  QMessageLogger::warning
            ((QMessageLogger *)&stack0xffffffffffffffd8,
             "QSequentialAnimationGroup::insertPause: index is out of bounds");
  local_30 = (QPauseAnimation *)0x0;
LAB_0068a85d:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_30;
  }
  __stack_chk_fail();
}

Assistant:

QPauseAnimation *QSequentialAnimationGroup::insertPause(int index, int msecs)
{
    Q_D(const QSequentialAnimationGroup);

    if (index < 0 || index > d->animations.size()) {
        qWarning("QSequentialAnimationGroup::insertPause: index is out of bounds");
        return nullptr;
    }

    QPauseAnimation *pause = new QPauseAnimation(msecs);
    insertAnimation(index, pause);
    return pause;
}